

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes3Context.cpp
# Opt level: O3

void __thiscall deqp::gles3::Context::Context(Context *this,TestContext *testCtx)

{
  int iVar1;
  RenderContext *context;
  ContextInfo *pCVar2;
  undefined4 extraout_var;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = (RenderContext *)0x0;
  this->m_contextInfo = (ContextInfo *)0x0;
  context = glu::createDefaultRenderContext(testCtx->m_platform,testCtx->m_cmdLine,(ApiType)0x3);
  this->m_renderCtx = context;
  pCVar2 = glu::ContextInfo::create(context);
  this->m_contextInfo = pCVar2;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glw::setCurrentThreadFunctions((Functions *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

Context::Context (tcu::TestContext& testCtx)
	: m_testCtx		(testCtx)
	, m_renderCtx	(DE_NULL)
	, m_contextInfo	(DE_NULL)
{
	try
	{
		m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3,0));
		m_contextInfo	= glu::ContextInfo::create(*m_renderCtx);

		// Set up function table for transparent wrapper.
		glw::setCurrentThreadFunctions(&m_renderCtx->getFunctions());
	}
	catch (...)
	{
		glw::setCurrentThreadFunctions(DE_NULL);

		delete m_contextInfo;
		delete m_renderCtx;

		throw;
	}
}